

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall
rsg::TexLookup::TexLookup(TexLookup *this,GeneratorState *state,ConstValueRangeAccess valueRange)

{
  Random *this_00;
  ValueEntry **ppVVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  ShaderParameters *pSVar6;
  Variable *variable;
  __normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  iter;
  IsSamplerEntry filter;
  ValueEntry *pVVar7;
  int ndx;
  int iVar8;
  vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_> typeCandidates;
  ValueEntryIterator<rsg::(anonymous_namespace)::IsSamplerEntry> local_98;
  VariableType local_80;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_0072cb40;
  this->m_type = TYPE_LAST;
  this->m_coordExpr = (Expression *)0x0;
  this->m_lodBiasExpr = (Expression *)0x0;
  (this->m_valueType).m_baseType = TYPE_FLOAT;
  (this->m_valueType).m_precision = PRECISION_NONE;
  (this->m_valueType).m_typeName._M_dataplus._M_p = (pointer)&(this->m_valueType).m_typeName.field_2
  ;
  (this->m_valueType).m_typeName._M_string_length = 0;
  (this->m_valueType).m_typeName.field_2._M_local_buf[0] = '\0';
  (this->m_valueType).m_numElements = 4;
  (this->m_valueType).m_elementType = (VariableType *)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_valueType).m_members.
  super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ValueStorage<64>::ValueStorage(&this->m_value,&this->m_valueType);
  typeCandidates.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  typeCandidates.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  typeCandidates.super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar6 = state->m_shaderParams;
  if (pSVar6->useTexture2D == true) {
    local_80.m_baseType = TYPE_VOID;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
    local_80.m_baseType = TYPE_FLOAT;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
    local_80.m_baseType = TYPE_INT;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
    local_80.m_baseType = TYPE_BOOL;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
    pSVar6 = state->m_shaderParams;
  }
  if (pSVar6->useTextureCube == true) {
    local_80.m_baseType = TYPE_STRUCT;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
    local_80.m_baseType = TYPE_ARRAY;
    std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::
    emplace_back<rsg::TexLookup::Type>(&typeCandidates,&local_80.m_baseType);
  }
  TVar3 = de::Random::
          choose<rsg::TexLookup::Type,__gnu_cxx::__normal_iterator<rsg::TexLookup::Type*,std::vector<rsg::TexLookup::Type,std::allocator<rsg::TexLookup::Type>>>>
                    (state->m_random,
                     (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
                      )typeCandidates.
                       super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<rsg::TexLookup::Type_*,_std::vector<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>_>
                      )typeCandidates.
                       super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  this->m_type = TVar3;
  if (TVar3 < TYPE_TEXTURECUBE) {
    filter.m_type = TYPE_SAMPLER_2D;
    bVar2 = true;
  }
  else {
    if (TVar3 - TYPE_TEXTURECUBE < 2) {
      filter.m_type = TYPE_SAMPLER_CUBE;
    }
    else {
      filter.m_type = TYPE_LAST;
    }
    bVar2 = false;
  }
  iVar4 = countSamplers(state->m_varManager,TYPE_SAMPLER_2D);
  iVar5 = countSamplers(state->m_varManager,TYPE_SAMPLER_CUBE);
  iVar8 = iVar5;
  if (bVar2) {
    iVar8 = iVar4;
  }
  if (iVar8 < 1) {
LAB_005431a2:
    local_80.m_typeName._M_dataplus._M_p = (pointer)&local_80.m_typeName.field_2;
    local_80.m_precision = PRECISION_NONE;
    local_80.m_typeName._M_string_length = 0;
    local_80.m_typeName.field_2._M_local_buf[0] = '\0';
    local_80.m_numElements = 1;
    local_80.m_elementType = (VariableType *)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80.m_baseType = filter.m_type;
    variable = VariableManager::allocate(state->m_varManager,&local_80);
    VariableType::~VariableType(&local_80);
    VariableManager::setStorage(state->m_varManager,variable,STORAGE_UNIFORM);
  }
  else {
    if (iVar5 + iVar4 < state->m_shaderParams->maxSamplers) {
      bVar2 = de::Random::getBool(state->m_random);
      if (bVar2) goto LAB_005431a2;
    }
    this_00 = state->m_random;
    VariableManager::getBegin<rsg::(anonymous_namespace)::IsSamplerEntry>
              (&local_98,state->m_varManager,filter);
    ppVVar1 = (state->m_varManager->m_entryCache).
              super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pVVar7 = (ValueEntry *)0x0;
    iVar8 = 0;
    iter._M_current =
         local_98.
         super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
         .m_iter._M_current;
    while (iter._M_current != ppVVar1) {
      if (iVar8 < 1) {
LAB_00543258:
        pVVar7 = *iter._M_current;
      }
      else {
        iVar4 = de::Random::getInt(this_00,0,iVar8);
        if (iVar4 < 1) goto LAB_00543258;
      }
      iter = FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
             ::findNext(local_98.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
                        .m_filter,iter,
                        local_98.
                        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::(anonymous_namespace)::IsSamplerEntry>
                        .m_end);
      iVar8 = iVar8 + 1;
    }
    variable = pVVar7->m_variable;
  }
  this->m_sampler = variable;
  std::_Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>::~_Vector_base
            (&typeCandidates.
              super__Vector_base<rsg::TexLookup::Type,_std::allocator<rsg::TexLookup::Type>_>);
  return;
}

Assistant:

TexLookup::TexLookup (GeneratorState& state, ConstValueRangeAccess valueRange)
	: m_type			(TYPE_LAST)
	, m_coordExpr		(DE_NULL)
	, m_lodBiasExpr		(DE_NULL)
	, m_valueType		(VariableType::TYPE_FLOAT, 4)
	, m_value			(m_valueType)
{
	DE_ASSERT(valueRange.getType() == VariableType(VariableType::TYPE_FLOAT, 4));
	DE_UNREF(valueRange); // Texture output value range is constant.

	// Select type.
	vector<Type> typeCandidates;
	if (state.getShaderParameters().useTexture2D)
	{
		typeCandidates.push_back(TYPE_TEXTURE2D);
		typeCandidates.push_back(TYPE_TEXTURE2D_LOD);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ);
		typeCandidates.push_back(TYPE_TEXTURE2D_PROJ_LOD);
	}

	if (state.getShaderParameters().useTextureCube)
	{
		typeCandidates.push_back(TYPE_TEXTURECUBE);
		typeCandidates.push_back(TYPE_TEXTURECUBE_LOD);
	}

	m_type = state.getRandom().choose<Type>(typeCandidates.begin(), typeCandidates.end());

	// Select or allocate sampler.
	VariableType::Type samplerType = VariableType::TYPE_LAST;
	switch (m_type)
	{
		case TYPE_TEXTURE2D:
		case TYPE_TEXTURE2D_LOD:
		case TYPE_TEXTURE2D_PROJ:
		case TYPE_TEXTURE2D_PROJ_LOD:
			samplerType = VariableType::TYPE_SAMPLER_2D;
			break;

		case TYPE_TEXTURECUBE:
		case TYPE_TEXTURECUBE_LOD:
			samplerType = VariableType::TYPE_SAMPLER_CUBE;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	int		sampler2DCount		= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_2D);
	int		samplerCubeCount	= countSamplers(state.getVariableManager(), VariableType::TYPE_SAMPLER_CUBE);
	bool	canAllocSampler		= sampler2DCount + samplerCubeCount < state.getShaderParameters().maxSamplers;
	bool	hasSampler			= samplerType == VariableType::TYPE_SAMPLER_2D ? (sampler2DCount > 0) : (samplerCubeCount > 0);
	bool	allocSampler		= !hasSampler || (canAllocSampler && state.getRandom().getBool());

	if (allocSampler)
	{
		Variable* sampler = state.getVariableManager().allocate(VariableType(samplerType, 1));
		state.getVariableManager().setStorage(sampler, Variable::STORAGE_UNIFORM); // Samplers are always uniforms.
		m_sampler = sampler;
	}
	else
		m_sampler = state.getRandom().choose<const ValueEntry*>(state.getVariableManager().getBegin(IsSamplerEntry(samplerType)),
															    state.getVariableManager().getEnd(IsSamplerEntry(samplerType)))->getVariable();
}